

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseEventFunction(StructuralParser *this)

{
  Scope *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ModuleBase *pMVar5;
  undefined4 extraout_var;
  Identifier IVar6;
  Function *pFVar7;
  ConcreteType *pCVar8;
  Expression *pEVar9;
  VariableDeclaration *pVVar10;
  Block *pBVar11;
  bool local_91;
  Context local_90;
  void *local_78;
  Context context;
  pool_ptr<soul::AST::Function> local_38;
  
  pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  iVar3 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[0xc])(pMVar5);
  if ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
       *)CONCAT44(extraout_var,iVar3) !=
      (vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
       *)0x0) {
    pMVar5 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
    iVar4 = (*(pMVar5->super_ASTObject)._vptr_ASTObject[4])(pMVar5);
    if ((char)iVar4 != '\0') goto LAB_0020cf9b;
  }
  Errors::noEventFunctionsAllowed<>();
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&context);
  CompileMessage::~CompileMessage((CompileMessage *)&context);
LAB_0020cf9b:
  getContext(&context,this);
  IVar6 = parseIdentifierWithMaxLength(this,0x80);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b537);
  pFVar7 = allocate<soul::AST::Function,soul::AST::Context&>(this,&context);
  pSVar1 = this->currentScope;
  this->currentScope = &pFVar7->super_Scope;
  local_90.location.sourceCode.object = (SourceCodeText *)pFVar7;
  std::
  vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>::
  emplace_back<soul::pool_ref<soul::AST::Function>>
            ((vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>
              *)CONCAT44(extraout_var,iVar3),(pool_ref<soul::AST::Function> *)&local_90);
  local_90.location.sourceCode.object._0_4_ = 1;
  pCVar8 = allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::PrimitiveType::Primitive>
                     (this,&context,(Primitive *)&local_90);
  (pFVar7->returnType).object = &pCVar8->super_Expression;
  (pFVar7->name).name = IVar6.name;
  AST::Context::operator=(&pFVar7->nameLocation,&context);
  pFVar7->eventFunction = true;
  pEVar9 = parseType(this,functionParameter);
  getContext(&local_90,this);
  local_78 = (void *)0x0;
  local_91 = false;
  pVVar10 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                      (this,&local_90,pEVar9,&local_78,&local_91);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_90);
  local_90.location.sourceCode.object = (SourceCodeText *)pVVar10;
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
            ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
              *)&pFVar7->parameters,(pool_ref<soul::AST::VariableDeclaration> *)&local_90);
  pVVar10->isFunctionParameter = true;
  IVar6 = parseIdentifier(this);
  (pVVar10->name).name = IVar6.name;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
  if (bVar2) {
    pEVar9 = parseType(this,functionParameter);
    getContext(&local_90,this);
    local_78 = (void *)0x0;
    local_91 = false;
    pVVar10 = allocate<soul::AST::VariableDeclaration,soul::AST::Context,soul::AST::Expression&,decltype(nullptr),bool>
                        (this,&local_90,pEVar9,&local_78,&local_91);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_90);
    local_90.location.sourceCode.object = (SourceCodeText *)pVVar10;
    std::
    vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
              ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                *)&pFVar7->parameters,(pool_ref<soul::AST::VariableDeclaration> *)&local_90);
    pVVar10->isFunctionParameter = true;
    IVar6 = parseIdentifier(this);
    (pVVar10->name).name = IVar6.name;
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
  local_38.object = pFVar7;
  pBVar11 = parseBracedBlock(this,&local_38);
  (pFVar7->block).object = pBVar11;
  this->currentScope = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&context);
  return;
}

Assistant:

void parseEventFunction()
    {
        auto functions = module->getFunctionList();

        if (functions == nullptr || ! module->isProcessor())
            throwError (Errors::noEventFunctionsAllowed());

        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        expect (Operator::openParen);
        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        functions->push_back (f);
        f.returnType = allocate<AST::ConcreteType> (context, PrimitiveType::void_);
        f.name = name;
        f.nameLocation = context;
        f.eventFunction = true;

        // Event functions have either 1 argument (the type of the event) or two arguments
        // (an index followed by the type of the event) if the input is an event array

        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        if (matchIf (Operator::comma))
        {
            auto& type = parseType (ParseTypeContext::functionParameter);
            auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
            f.parameters.push_back (v);
            v.isFunctionParameter = true;
            v.name = parseIdentifier();
        }

        expect (Operator::closeParen);
        f.block = parseBracedBlock (f);
    }